

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * CLI::detail::remove_outer(string *str,char key)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  iterator __last;
  char in_SIL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined4 in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  __const_iterator in_stack_ffffffffffffffe8;
  
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                    (in_RDI);
  if ((1 < sVar2) &&
     (pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               front(in_stack_ffffffffffffffb0), *pvVar3 == in_SIL)) {
    pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                       (in_stack_ffffffffffffffb0);
    iVar1 = (int)*pvVar3;
    pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                       (in_stack_ffffffffffffffb0);
    if (iVar1 == *pvVar3) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                (in_stack_ffffffffffffffb0);
      this = in_RDI;
      __last = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               begin(in_stack_ffffffffffffffa8);
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_ffffffffffffffa8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                (in_stack_ffffffffffffffa8);
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),(difference_type)this);
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_ffffffffffffffa8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffe8,
                 (__const_iterator)__last._M_current);
    }
  }
  return in_RDI;
}

Assistant:

CLI11_INLINE std::string &remove_outer(std::string &str, char key) {
    if(str.length() > 1 && (str.front() == key)) {
        if(str.front() == str.back()) {
            str.pop_back();
            str.erase(str.begin(), str.begin() + 1);
        }
    }
    return str;
}